

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Node::AddP70double(Node *this,string *name,double value)

{
  Node n;
  allocator<char> local_c9;
  double local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  Node local_80;
  
  local_c8 = value;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"P",&local_c9);
  Node(&local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_c0,(string *)name);
  AddProperties<std::__cxx11::string,char_const*,char_const*,char_const*,double>
            (&local_80,&local_c0,"double","Number","",local_c8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
            (&this->children,&local_80);
  ~Node(&local_80);
  return;
}

Assistant:

void FBX::Node::AddP70double(
    const std::string& name, double value
) {
    FBX::Node n("P");
    n.AddProperties(name, "double", "Number", "", value);
    AddChild(n);
}